

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::OrderedPortConnectionSyntax::setChild
          (OrderedPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  
  pSVar3 = TokenOrSyntax::node(&child);
  if (index == 0) {
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
         = pSVar3->previewNode;
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar3->kind;
    *(undefined4 *)
     &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
         = uVar2;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         pSVar1;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pSVar3 = (SyntaxNode *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (PropertyExprSyntax *)pSVar3;
  }
  return;
}

Assistant:

void OrderedPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}